

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmMoves<(moira::Instr)132,(moira::Mode)7,1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  bool bVar2;
  u32 uVar3;
  StrWriter *pSVar4;
  Av<(moira::Instr)132,_(moira::Mode)7,_1> local_64;
  int local_60;
  int local_58;
  int local_50;
  int local_4c;
  Rn local_44;
  undefined1 local_40 [4];
  Rn rg;
  Ea<(moira::Mode)7,_1> ea;
  u16 ext;
  u32 old;
  u16 op_local;
  u32 *addr_local;
  StrWriter *str_local;
  Moira *this_local;
  
  uVar1 = *addr;
  uVar3 = dasmIncRead<2>(this,addr);
  Op<(moira::Mode)7,1>((Ea<(moira::Mode)7,_1> *)local_40,this,op & 7,addr);
  Rn::Rn(&local_44,(int)(uVar3 & 0xffff) >> 0xc);
  if ((str->style->syntax != MUSASHI) &&
     (bVar2 = isAvailable(this,this->dasmModel,MOVES,AW,1,(u16)uVar3), !bVar2)) {
    *addr = uVar1;
    dasmIllegal<(moira::Instr)132,(moira::Mode)7,1>(this,str,addr,op);
    return;
  }
  if ((uVar3 & 0x800) == 0) {
    pSVar4 = StrWriter::operator<<(str);
    pSVar4 = StrWriter::operator<<(pSVar4);
    local_58 = (str->tab).raw;
    pSVar4 = StrWriter::operator<<(pSVar4,(Tab)local_58);
    pSVar4 = StrWriter::operator<<(pSVar4,(Ea<(moira::Mode)7,_1> *)local_40);
    pSVar4 = StrWriter::operator<<(pSVar4);
    local_60 = local_44.raw;
    StrWriter::operator<<(pSVar4,local_44);
  }
  else {
    pSVar4 = StrWriter::operator<<(str);
    pSVar4 = StrWriter::operator<<(pSVar4);
    local_4c = (str->tab).raw;
    pSVar4 = StrWriter::operator<<(pSVar4,(Tab)local_4c);
    local_50 = local_44.raw;
    pSVar4 = StrWriter::operator<<(pSVar4,local_44);
    pSVar4 = StrWriter::operator<<(pSVar4);
    StrWriter::operator<<(pSVar4,(Ea<(moira::Mode)7,_1> *)local_40);
  }
  local_64.ext1 = 0;
  StrWriter::operator<<(str,&local_64);
  return;
}

Assistant:

void
Moira::dasmMoves(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = (u16)dasmIncRead<Word>(addr);
    auto ea = Op <M,S> ( _____________xxx(op), addr );
    auto rg = Rn ( xxxx____________(ext) );

    if (str.style.syntax != Syntax::MUSASHI && !isAvailable(dasmModel, I, M, S, ext)) {

        addr = old;
        dasmIllegal<I, M, S>(str, addr, op);
        return;
    }

    if (ext & 0x800) {      // Rg -> Ea
        str << Ins<I>{} << Sz<S>{} << str.tab << rg << Sep{} << ea;
    } else {                // Ea -> Rg
        str << Ins<I>{} << Sz<S>{} << str.tab << ea << Sep{} << rg;
    }
    str << Av<I, M, S>{};
}